

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this)

{
  IfcRelContainedInSpatialStructure *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xd8,"IfcRelContainedInSpatialStructure");
  IfcRelConnects::IfcRelConnects(&this->super_IfcRelConnects,&PTR_construction_vtable_24__00f5ca38);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure,_2UL> *)
             &(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8,
             &PTR_construction_vtable_24__00f5cab0);
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0xf5c980;
  *(undefined8 *)&this->field_0xd8 = 0xf5ca20;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 =
       0xf5c9a8;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 =
       0xf5c9d0;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 = 0xf5c9f8;
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_1UL,_0UL> *)
             &(this->super_IfcRelConnects).field_0xb8);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>::Lazy
            (&this->RelatingStructure,(LazyObject *)0x0);
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}